

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O1

void pnga_access_block_ptr(Integer g_a,Integer idx,void *ptr,Integer *ld)

{
  global_array_t *pgVar1;
  short *psVar2;
  short sVar3;
  short sVar4;
  int iVar5;
  C_Integer *pCVar6;
  global_array_t *pgVar7;
  Integer *pIVar8;
  C_Integer CVar9;
  int iVar10;
  long lVar11;
  ulong uVar12;
  Integer _dim;
  uint uVar13;
  int iVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  long lVar20;
  global_array_t *pgVar21;
  int _index [7];
  char *lptr;
  Integer lo [7];
  Integer hi [7];
  int local_128 [8];
  global_array_t *local_108;
  uint local_fc;
  Integer *local_f8;
  long *local_f0;
  long local_e8;
  long local_e0;
  long local_d8 [8];
  long local_98 [8];
  long local_58;
  long local_50;
  C_Integer **local_48;
  ulong local_40;
  Integer local_38;
  
  lVar11 = g_a + 1000;
  sVar3 = GA[lVar11].ndim;
  if ((idx < 0) || (GA[lVar11].block_total <= idx)) {
    pnga_error("block index outside allowed values",idx);
  }
  pgVar7 = GA;
  iVar14 = (int)idx;
  if (GA[lVar11].distr_type - 2U < 3) {
    sVar3 = GA[lVar11].ndim;
    local_d8[0] = (long)iVar14 % GA[lVar11].num_blocks[0];
    if (1 < (long)sVar3) {
      lVar17 = 0;
      lVar11 = local_d8[0];
      do {
        idx = ((int)idx - lVar11) / GA[g_a + 1000].num_blocks[lVar17];
        lVar11 = (long)(int)idx % GA[g_a + 1000].num_blocks[lVar17 + 1];
        local_d8[lVar17 + 1] = lVar11;
        lVar17 = lVar17 + 1;
      } while ((long)sVar3 + -1 != lVar17);
    }
    pnga_access_block_grid_ptr(g_a,local_d8,&local_e0,ld);
    goto LAB_0016ff1c;
  }
  if (GA[lVar11].distr_type != 1) goto LAB_0016ff1c;
  local_f8 = ld;
  local_f0 = (long *)ptr;
  local_38 = GAnproc;
  lVar17 = idx % GAnproc;
  local_50 = lVar11 * 0x368;
  local_58 = lVar17;
  if (lVar17 < idx) {
    pgVar1 = GA + lVar11;
    local_48 = &GA[lVar11].mapc;
    pgVar21 = GA + g_a;
    lVar20 = 0;
    local_40 = (ulong)(uint)GA[lVar11].distr_type;
    local_fc = GA[lVar11].distr_type - 1;
    local_108 = pgVar21;
    do {
      local_e8 = lVar20;
      if (local_fc < 3) {
        sVar4 = pgVar1->ndim;
        uVar13 = (uint)sVar4;
        uVar12 = (long)(int)lVar17 % pgVar1->num_blocks[0];
        local_128[0] = (int)uVar12;
        if (1 < (int)uVar13) {
          uVar12 = uVar12 & 0xffffffff;
          lVar20 = 0;
          lVar11 = lVar17;
          do {
            lVar11 = (long)((int)lVar11 - (int)uVar12) / pgVar7[g_a + 1000].num_blocks[lVar20];
            uVar12 = (long)(int)lVar11 % pgVar7[g_a + 1000].num_blocks[lVar20 + 1];
            local_128[lVar20 + 1] = (int)uVar12;
            lVar20 = lVar20 + 1;
          } while ((ulong)uVar13 - 1 != lVar20);
        }
        if (0 < sVar4) {
          lVar11 = 0;
          do {
            iVar10 = *(int *)((long)local_128 + lVar11);
            lVar20 = *(long *)((long)pgVar7[g_a + 1000].block_dims + lVar11 * 2);
            *(long *)((long)local_d8 + lVar11 * 2) = lVar20 * iVar10 + 1;
            lVar20 = ((long)iVar10 + 1) * lVar20;
            *(long *)((long)local_98 + lVar11 * 2) = lVar20;
            lVar16 = *(long *)((long)pgVar7[g_a + 1000].dims + lVar11 * 2);
            if (lVar16 <= lVar20) {
              lVar20 = lVar16;
            }
            *(long *)((long)local_98 + lVar11 * 2) = lVar20;
            lVar11 = lVar11 + 4;
          } while ((ulong)uVar13 << 2 != lVar11);
        }
      }
      else if ((int)local_40 == 4) {
        sVar4 = pgVar1->ndim;
        uVar13 = (uint)sVar4;
        uVar12 = (long)(int)lVar17 % pgVar1->num_blocks[0];
        local_128[0] = (int)uVar12;
        if (1 < (int)uVar13) {
          uVar12 = uVar12 & 0xffffffff;
          lVar20 = 0;
          lVar11 = lVar17;
          do {
            lVar11 = (long)((int)lVar11 - (int)uVar12) / pgVar7[g_a + 1000].num_blocks[lVar20];
            uVar12 = (long)(int)lVar11 % pgVar7[g_a + 1000].num_blocks[lVar20 + 1];
            local_128[lVar20 + 1] = (int)uVar12;
            lVar20 = lVar20 + 1;
          } while ((ulong)uVar13 - 1 != lVar20);
        }
        if (0 < sVar4) {
          pCVar6 = *local_48;
          lVar11 = 0;
          iVar10 = 0;
          do {
            iVar5 = *(int *)((long)local_128 + lVar11);
            lVar20 = (long)iVar10 + (long)iVar5;
            *(C_Integer *)((long)local_d8 + lVar11 * 2) = pCVar6[lVar20];
            if ((long)iVar5 < *(long *)((long)pgVar1->num_blocks + lVar11 * 2) + -1) {
              lVar20 = pgVar1->mapc[lVar20 + 1] + -1;
            }
            else {
              lVar20 = *(long *)((long)pgVar1->dims + lVar11 * 2);
            }
            *(long *)((long)local_98 + lVar11 * 2) = lVar20;
            iVar10 = iVar10 + *(int *)((long)pgVar1->num_blocks + lVar11 * 2);
            lVar11 = lVar11 + 4;
          } while ((ulong)uVar13 << 2 != lVar11);
        }
      }
      else if ((int)local_40 == 0) {
        if (pgVar1->num_rstrctd == 0) {
          lVar20 = (long)pgVar1->ndim;
          lVar11 = 1;
          if (0 < lVar20) {
            lVar16 = 0;
            do {
              lVar11 = lVar11 * pgVar7[g_a + 1000].nblock[lVar16];
              lVar16 = lVar16 + 1;
            } while (lVar20 != lVar16);
          }
          if ((-1 < lVar17) && (lVar17 < lVar11)) {
            if (0 < pgVar1->ndim) {
              pCVar6 = pgVar1->mapc;
              lVar16 = 0;
              lVar15 = 0;
              lVar11 = lVar17;
              do {
                lVar18 = (long)pgVar21[1000].nblock[lVar16];
                lVar19 = lVar11 % lVar18;
                local_d8[lVar16] = pCVar6[lVar19 + lVar15];
                if (lVar19 == lVar18 + -1) {
                  CVar9 = pgVar21[1000].dims[lVar16];
                }
                else {
                  CVar9 = pCVar6[lVar19 + lVar15 + 1] + -1;
                }
                lVar15 = lVar15 + lVar18;
                local_98[lVar16] = CVar9;
                lVar16 = lVar16 + 1;
                lVar11 = lVar11 / lVar18;
              } while (lVar20 != lVar16);
            }
            goto LAB_0016fabf;
          }
        }
        else {
          sVar4 = pgVar1->ndim;
          lVar20 = (long)sVar4;
          if (lVar17 < pgVar1->num_rstrctd) {
            lVar11 = 1;
            if (0 < sVar4) {
              lVar16 = 0;
              do {
                lVar11 = lVar11 * pgVar7[g_a + 1000].nblock[lVar16];
                lVar16 = lVar16 + 1;
              } while (lVar20 != lVar16);
            }
            if ((-1 < lVar17) && (lVar17 < lVar11)) {
              if (0 < sVar4) {
                pCVar6 = pgVar1->mapc;
                lVar16 = 0;
                lVar15 = 0;
                lVar11 = lVar17;
                do {
                  lVar18 = (long)pgVar21[1000].nblock[lVar16];
                  lVar19 = lVar11 % lVar18;
                  local_d8[lVar16] = pCVar6[lVar19 + lVar15];
                  if (lVar19 == lVar18 + -1) {
                    CVar9 = pgVar21[1000].dims[lVar16];
                  }
                  else {
                    CVar9 = pCVar6[lVar19 + lVar15 + 1] + -1;
                  }
                  lVar15 = lVar15 + lVar18;
                  local_98[lVar16] = CVar9;
                  lVar16 = lVar16 + 1;
                  lVar11 = lVar11 / lVar18;
                } while (lVar20 != lVar16);
              }
              goto LAB_0016fabf;
            }
          }
        }
        if (0 < (short)lVar20) {
          memset(local_d8,0,lVar20 << 3);
          memset(local_98,0xff,lVar20 << 3);
          pgVar21 = local_108;
        }
      }
LAB_0016fabf:
      lVar20 = 1;
      if (0 < sVar3) {
        lVar11 = 0;
        do {
          lVar20 = lVar20 * ((local_98[lVar11] - local_d8[lVar11]) + 1);
          lVar11 = lVar11 + 1;
        } while (sVar3 != lVar11);
      }
      lVar20 = local_e8 + lVar20;
      lVar17 = lVar17 + local_38;
    } while (lVar17 < idx);
  }
  else {
    lVar20 = 0;
  }
  ptr = local_f0;
  pIVar8 = local_f8;
  psVar2 = (short *)((long)pgVar7->dims + local_50 + -0x30);
  local_e0 = *(int *)((long)pgVar7->dims + local_50 + -0x18) * lVar20 +
             *(long *)(*(long *)(pgVar7->name + local_50 + -0x10) + local_58 * 8);
  iVar10 = *(int *)((long)pgVar7->block_dims + local_50 + -4);
  if (iVar10 - 1U < 3) {
    sVar4 = *psVar2;
    uVar13 = (uint)sVar4;
    local_128[0] = (int)((long)iVar14 % *(long *)(psVar2 + 0x130));
    if (1 < (int)uVar13) {
      uVar12 = (long)iVar14 % *(long *)(psVar2 + 0x130) & 0xffffffff;
      lVar11 = 0;
      do {
        idx = (long)((int)idx - (int)uVar12) / pgVar7[g_a + 1000].num_blocks[lVar11];
        uVar12 = (long)(int)idx % pgVar7[g_a + 1000].num_blocks[lVar11 + 1];
        local_128[lVar11 + 1] = (int)uVar12;
        lVar11 = lVar11 + 1;
      } while ((ulong)uVar13 - 1 != lVar11);
    }
    if (0 < sVar4) {
      lVar11 = 0;
      do {
        iVar14 = *(int *)((long)local_128 + lVar11);
        lVar17 = *(long *)((long)pgVar7[g_a + 1000].block_dims + lVar11 * 2);
        *(long *)((long)local_d8 + lVar11 * 2) = lVar17 * iVar14 + 1;
        lVar17 = ((long)iVar14 + 1) * lVar17;
        *(long *)((long)local_98 + lVar11 * 2) = lVar17;
        lVar20 = *(long *)((long)pgVar7[g_a + 1000].dims + lVar11 * 2);
        if (lVar20 <= lVar17) {
          lVar17 = lVar20;
        }
        *(long *)((long)local_98 + lVar11 * 2) = lVar17;
        lVar11 = lVar11 + 4;
      } while ((ulong)uVar13 << 2 != lVar11);
    }
  }
  else if (iVar10 == 4) {
    sVar4 = *psVar2;
    uVar13 = (uint)sVar4;
    local_128[0] = (int)((long)iVar14 % *(long *)(psVar2 + 0x130));
    if (1 < (int)uVar13) {
      uVar12 = (long)iVar14 % *(long *)(psVar2 + 0x130) & 0xffffffff;
      lVar11 = 0;
      do {
        idx = (long)((int)idx - (int)uVar12) / pgVar7[g_a + 1000].num_blocks[lVar11];
        uVar12 = (long)(int)idx % pgVar7[g_a + 1000].num_blocks[lVar11 + 1];
        local_128[lVar11 + 1] = (int)uVar12;
        lVar11 = lVar11 + 1;
      } while ((ulong)uVar13 - 1 != lVar11);
    }
    if (0 < sVar4) {
      lVar11 = *(long *)(pgVar7->name + local_50 + -8);
      lVar17 = 0;
      iVar14 = 0;
      do {
        iVar10 = *(int *)((long)local_128 + lVar17);
        lVar20 = (long)iVar14 + (long)iVar10;
        *(undefined8 *)((long)local_d8 + lVar17 * 2) = *(undefined8 *)(lVar11 + lVar20 * 8);
        if ((long)iVar10 < *(long *)(psVar2 + lVar17 + 0x130) + -1) {
          lVar20 = *(long *)(*(long *)(psVar2 + 0xf4) + 8 + lVar20 * 8) + -1;
        }
        else {
          lVar20 = *(long *)(psVar2 + lVar17 + 0x18);
        }
        *(long *)((long)local_98 + lVar17 * 2) = lVar20;
        iVar14 = iVar14 + *(int *)(psVar2 + lVar17 + 0x130);
        lVar17 = lVar17 + 4;
      } while ((ulong)uVar13 << 2 != lVar17);
    }
  }
  else if (iVar10 == 0) {
    if (*(long *)(psVar2 + 0x154) == 0) {
      lVar11 = (long)*psVar2;
      if (lVar11 < 1) {
        lVar17 = 1;
      }
      else {
        lVar17 = 1;
        lVar20 = 0;
        do {
          lVar17 = lVar17 * pgVar7[g_a + 1000].nblock[lVar20];
          lVar20 = lVar20 + 1;
        } while (lVar11 != lVar20);
      }
      if ((-1 < idx) && (idx < lVar17)) {
        if (0 < *psVar2) {
          lVar17 = *(long *)(psVar2 + 0xf4);
          lVar20 = 0;
          lVar16 = 0;
          do {
            lVar19 = (long)pgVar7[g_a + 1000].nblock[lVar16];
            lVar15 = lVar17 + (idx % lVar19) * 8;
            local_d8[lVar16] = *(long *)(lVar15 + lVar20 * 8);
            if (idx % lVar19 == lVar19 + -1) {
              CVar9 = pgVar7[g_a + 1000].dims[lVar16];
            }
            else {
              CVar9 = *(long *)(lVar15 + 8 + lVar20 * 8) + -1;
            }
            lVar20 = lVar20 + lVar19;
            local_98[lVar16] = CVar9;
            lVar16 = lVar16 + 1;
            idx = idx / lVar19;
          } while (lVar11 != lVar16);
        }
        goto LAB_0016fef5;
      }
    }
    else {
      sVar4 = *psVar2;
      lVar11 = (long)sVar4;
      if (idx < *(long *)(psVar2 + 0x154)) {
        if (sVar4 < 1) {
          lVar17 = 1;
        }
        else {
          lVar17 = 1;
          lVar20 = 0;
          do {
            lVar17 = lVar17 * pgVar7[g_a + 1000].nblock[lVar20];
            lVar20 = lVar20 + 1;
          } while (lVar11 != lVar20);
        }
        if ((-1 < idx) && (idx < lVar17)) {
          if (0 < sVar4) {
            lVar17 = *(long *)(psVar2 + 0xf4);
            lVar20 = 0;
            lVar16 = 0;
            do {
              lVar19 = (long)pgVar7[g_a + 1000].nblock[lVar16];
              lVar15 = lVar17 + (idx % lVar19) * 8;
              local_d8[lVar16] = *(long *)(lVar15 + lVar20 * 8);
              if (idx % lVar19 == lVar19 + -1) {
                CVar9 = pgVar7[g_a + 1000].dims[lVar16];
              }
              else {
                CVar9 = *(long *)(lVar15 + 8 + lVar20 * 8) + -1;
              }
              lVar20 = lVar20 + lVar19;
              local_98[lVar16] = CVar9;
              lVar16 = lVar16 + 1;
              idx = idx / lVar19;
            } while (lVar11 != lVar16);
          }
          goto LAB_0016fef5;
        }
      }
    }
    if (0 < (short)lVar11) {
      memset(local_d8,0,lVar11 << 3);
      memset(local_98,0xff,lVar11 << 3);
    }
  }
LAB_0016fef5:
  if (1 < sVar3) {
    lVar11 = 0;
    do {
      pIVar8[lVar11] = (local_98[lVar11] - local_d8[lVar11]) + 1;
      lVar11 = lVar11 + 1;
    } while ((long)sVar3 + -1 != lVar11);
  }
LAB_0016ff1c:
  *(long *)ptr = local_e0;
  return;
}

Assistant:

void pnga_access_block_ptr(Integer g_a, Integer idx, void* ptr, Integer *ld)
            /* g_a: array handle [input]
             * idx: block index  [input]
             * ptr: pointer to data in block [output]
             * ld:  array of strides for block data [output]
             */
{
  char *lptr;
  Integer  handle = GA_OFFSET + g_a;
  Integer  i, j/*, p_handle*/, nblocks, offset, tsum, inode;
  Integer ndim, lo[MAXDIM], hi[MAXDIM], index;

  
  /*p_handle = GA[handle].p_handle;*/
  nblocks = GA[handle].block_total;
  ndim = GA[handle].ndim;
  index = idx;
  if (index < 0 || index >= nblocks)
    pnga_error("block index outside allowed values",index);

  if (GA[handle].distr_type == BLOCK_CYCLIC) {
    offset = 0;
    inode = index%GAnproc;
    for (i=inode; i<index; i += GAnproc) {
      ga_ownsM(handle,i,lo,hi); 
      tsum = 1;
      for (j=0; j<ndim; j++) {
        tsum *= (hi[j]-lo[j]+1);
      }
      offset += tsum;
    }
    lptr = GA[handle].ptr[inode]+offset*GA[handle].elemsize;

    ga_ownsM(handle,index,lo,hi); 
    for (i=0; i<ndim-1; i++) {
      ld[i] = hi[i]-lo[i]+1;
    }
  } else if (GA[handle].distr_type == SCALAPACK ||
      GA[handle].distr_type == TILED ||
      GA[handle].distr_type == TILED_IRREG) {
    Integer indices[MAXDIM];
    /* find block indices */
    gam_find_block_indices(handle,index,indices);
    /* find pointer */
    pnga_access_block_grid_ptr(g_a, indices, &lptr, ld);
  }
  *(char**)ptr = lptr; 

}